

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

uint32_t __thiscall cfd::TransactionController::GetSizeIgnoreTxIn(TransactionController *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  TxOutReference *txout;
  AbstractTxOutReference *this_00;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> txouts;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> local_30;
  
  core::Transaction::GetTxOutList(&local_30,&this->transaction_);
  uVar2 = 10;
  for (this_00 = &(local_30.
                   super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                   ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOutReference;
      this_00 !=
      &(local_30.
        super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
        _M_impl.super__Vector_impl_data._M_finish)->super_AbstractTxOutReference;
      this_00 = this_00 + 1) {
    uVar1 = core::AbstractTxOutReference::GetSerializeSize(this_00);
    uVar2 = uVar2 + uVar1;
  }
  std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
            (&local_30);
  return uVar2;
}

Assistant:

uint32_t TransactionController::GetSizeIgnoreTxIn() const {
  uint32_t result = AbstractTransaction::kTransactionMinimumSize;
  std::vector<TxOutReference> txouts = transaction_.GetTxOutList();
  for (const auto& txout : txouts) {
    result += txout.GetSerializeSize();
  }
  return result;
}